

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiScene * __thiscall
Assimp::Importer::ApplyCustomizedPostProcessing
          (Importer *this,BaseProcess *rootProcess,bool requestValidation)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  pointer pPVar4;
  pointer local_118;
  undefined1 local_e8 [8];
  ValidateDSProcess ds_1;
  string local_c0;
  allocator local_99;
  string local_98;
  undefined1 local_71;
  Profiler *local_70;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  local_68;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  undefined1 local_58 [8];
  ValidateDSProcess ds;
  bool requestValidation_local;
  BaseProcess *rootProcess_local;
  Importer *this_local;
  
  if (this->pimpl->mScene == (aiScene *)0x0) {
    this_local = (Importer *)0x0;
  }
  else if (rootProcess == (BaseProcess *)0x0) {
    this_local = (Importer *)this->pimpl->mScene;
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"Entering customized post processing pipeline");
    if (requestValidation) {
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_58);
      BaseProcess::ExecuteOnScene((BaseProcess *)local_58,this);
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_ =
           this->pimpl->mScene == (aiScene *)0x0;
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_) {
        this_local = (Importer *)0x0;
      }
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._5_3_ = 0;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_58);
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ != 0) {
        return (aiScene *)this_local;
      }
    }
    local_71 = 0;
    iVar2 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
    if (iVar2 == 0) {
      local_118 = (pointer)0x0;
    }
    else {
      local_118 = (pointer)operator_new(0x30);
      local_71 = 1;
      local_70 = local_118;
      Profiling::Profiler::Profiler(local_118);
    }
    std::unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>::
    unique_ptr<std::default_delete<Assimp::Profiling::Profiler>,void>
              ((unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>
                *)&local_68,local_118);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
    if (bVar1) {
      pPVar4 = std::
               unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ::operator->(&local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,"postprocess",&local_99);
      Profiling::Profiler::BeginRegion(pPVar4,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    BaseProcess::ExecuteOnScene(rootProcess,this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
    if (bVar1) {
      pPVar4 = std::
               unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ::operator->(&local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c0,"postprocess",(allocator *)((long)&ds_1.mScene + 7));
      Profiling::Profiler::EndRegion(pPVar4,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ds_1.mScene + 7));
    }
    if (((this->pimpl->bExtraVerbose & 1U) != 0) || (requestValidation)) {
      pLVar3 = DefaultLogger::get();
      Logger::debug(pLVar3,"Verbose Import: revalidating data structures");
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_e8);
      BaseProcess::ExecuteOnScene((BaseProcess *)local_e8,this);
      if (this->pimpl->mScene == (aiScene *)0x0) {
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"Verbose Import: failed to revalidate data structures");
      }
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_e8);
    }
    SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"Leaving customized post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr(&local_68);
    this_local = (Importer *)this->pimpl->mScene;
  }
  return (aiScene *)this_local;
}

Assistant:

const aiScene* Importer::ApplyCustomizedPostProcessing( BaseProcess *rootProcess, bool requestValidation ) {
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // Return immediately if no scene is active
    if ( NULL == pimpl->mScene ) {
        return NULL;
    }

    // If no flags are given, return the current scene with no further action
    if ( NULL == rootProcess ) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ASSIMP_LOG_INFO( "Entering customized post processing pipeline" );

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if ( requestValidation )
    {
        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            return NULL;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if ( pimpl->bExtraVerbose )
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR( "Verbose Import is not available due to build settings" );
#endif  // no validation
    }
#else
    if ( pimpl->bExtraVerbose ) {
        ASSIMP_LOG_WARN( "Not a debug build, ignoring extra verbose setting" );
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler( GetPropertyInteger( AI_CONFIG_GLOB_MEASURE_TIME, 0 ) ? new Profiler() : NULL );

    if ( profiler ) {
        profiler->BeginRegion( "postprocess" );
    }

    rootProcess->ExecuteOnScene( this );

    if ( profiler ) {
        profiler->EndRegion( "postprocess" );
    }

    // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
    if ( pimpl->bExtraVerbose || requestValidation  ) {
        ASSIMP_LOG_DEBUG( "Verbose Import: revalidating data structures" );

        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            ASSIMP_LOG_ERROR( "Verbose Import: failed to revalidate data structures" );
        }
    }

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO( "Leaving customized post processing pipeline" );

    ASSIMP_END_EXCEPTION_REGION( const aiScene* );

    return pimpl->mScene;
}